

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdIsFindPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_69;
  undefined1 local_68 [36];
  int type_local;
  ByteData key_data;
  
  type_local = type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_68,"PsbtHandle",(allocator *)&key_data);
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  bVar1 = cfd::capi::IsEmptyString(key);
  if (bVar1) {
    local_68._0_8_ = "cfdcapi_psbt.cpp";
    local_68._8_4_ = 0x92b;
    local_68._16_8_ = "CfdIsFindPsbtRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_68,"key is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_68,"Failed to parameter. key is null or empty.",
               (allocator *)&key_data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_68);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)local_68,key,&local_69);
    cfd::core::ByteData::ByteData(&key_data,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    if (type == 1) {
      bVar1 = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)((long)psbt_handle + 0x18),&key_data);
    }
    else if (type == 2) {
      bVar1 = cfd::core::Psbt::IsFindTxInRecord
                        (*(Psbt **)((long)psbt_handle + 0x18),index,&key_data);
    }
    else {
      if (type != 3) {
        local_68._0_8_ = "cfdcapi_psbt.cpp";
        local_68._8_4_ = 0x944;
        local_68._16_8_ = "CfdIsFindPsbtRecord";
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)local_68,"type is invalid: {}",&type_local);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_68,"Failed to parameter. type is invalid.",&local_69);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_68);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      bVar1 = cfd::core::Psbt::IsFindTxOutRecord
                        (*(Psbt **)((long)psbt_handle + 0x18),index,&key_data);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
    return (uint)(bVar1 ^ 1) << 3;
  }
  local_68._0_8_ = "cfdcapi_psbt.cpp";
  local_68._8_4_ = 0x931;
  local_68._16_8_ = "CfdIsFindPsbtRecord";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_68,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_68,"Failed to handle statement. psbt is null.",(allocator *)&key_data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_68);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdIsFindPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* key) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    bool is_find = true;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}